

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9CompileString(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  sxi32 sVar4;
  byte *pbVar5;
  jx9_value *pObj;
  ushort **ppuVar6;
  sxu32 nLen;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  char *zData;
  ulong uVar10;
  ulong uVar11;
  byte *pbVar12;
  long lVar13;
  bool bVar14;
  sxi32 iCons;
  int c;
  int c_1;
  sxi32 local_4c;
  jx9_gen_state *local_48;
  int local_40;
  int local_3c;
  jx9_value *local_38;
  
  pbVar9 = (byte *)(pGen->pIn->sData).zString;
  pbVar12 = pbVar9 + (pGen->pIn->sData).nByte;
  local_4c = 0;
  local_48 = pGen;
LAB_001299cc:
  pObj = (jx9_value *)0x0;
LAB_001299cf:
  do {
    pbVar7 = pbVar9;
    pbVar2 = pbVar9;
    if (pbVar9 < pbVar12) {
      do {
        local_38 = pObj;
        pbVar5 = pbVar2 + 1;
        bVar14 = true;
        pbVar8 = pbVar7;
        if (*pbVar2 == 0x24) {
          if (pbVar5 < pbVar12) {
            bVar1 = *pbVar5;
            if (((0xffffffffffffffbf < (ulong)(long)(char)bVar1) ||
                (ppuVar6 = __ctype_b_loc(), pbVar8 = pbVar2, bVar1 == 0x5f)) ||
               (((*ppuVar6)[(char)bVar1] & 0x400) != 0)) goto LAB_00129a42;
          }
        }
        else if (*pbVar2 == 0x5c) goto LAB_00129a42;
        pbVar7 = pbVar7 + 1;
        pbVar2 = pbVar5;
        pObj = local_38;
      } while (pbVar5 < pbVar12);
      bVar14 = false;
      pbVar8 = pbVar5;
LAB_00129a42:
      pObj = local_38;
      if (pbVar8 <= pbVar9) goto LAB_00129a7e;
      if ((local_38 == (jx9_value *)0x0) &&
         (pObj = GenStateNewStrObj(local_48,&local_4c), pObj == (jx9_value *)0x0)) {
        return -10;
      }
      nLen = (int)pbVar8 - (int)pbVar9;
    }
    else {
      bVar14 = false;
      pbVar8 = pbVar9;
LAB_00129a7e:
      if ((pObj == (jx9_value *)0x0) &&
         (pObj = GenStateNewStrObj(local_48,&local_4c), pObj == (jx9_value *)0x0)) {
        return -10;
      }
      pbVar9 = (byte *)0x14647c;
      nLen = 0;
    }
    jx9MemObjStringAppend(pObj,(char *)pbVar9,nLen);
    if (!bVar14) {
LAB_00129eb5:
      if (1 < local_4c) {
        jx9VmEmitInstr(local_48->pVm,0xc,local_4c,0,(void *)0x0,(sxu32 *)0x0);
        return 0;
      }
      return 0;
    }
    if (*pbVar8 != 0x5c) {
      pbVar9 = pbVar8;
      if (*pbVar8 != 0x7b) {
        do {
          if ((pbVar12 <= pbVar9) || (*pbVar9 != 0x24)) {
LAB_00129b0e:
            if (pbVar12 <= pbVar9) {
              if (*pbVar9 < 0xc0) goto LAB_00129da9;
LAB_00129aef:
              pbVar9 = pbVar9 + 1;
              goto LAB_00129b0e;
            }
            bVar1 = *pbVar9;
            if (0xffffffffffffffbf < (ulong)(long)(char)bVar1) goto LAB_00129aef;
            ppuVar6 = __ctype_b_loc();
            if ((bVar1 == 0x5f) || (((*ppuVar6)[(char)bVar1] & 8) != 0)) {
              pbVar9 = pbVar9 + 1;
              goto LAB_00129b0e;
            }
            if (bVar1 != 0x2e) goto code_r0x00129b3c;
          }
          pbVar9 = pbVar9 + 1;
        } while( true );
      }
      pbVar8 = pbVar8 + 1;
      pbVar9 = pbVar8;
      if (pbVar12 <= pbVar8) goto LAB_00129e81;
      iVar3 = 1;
      goto LAB_00129e4a;
    }
    zData = (char *)(pbVar8 + 1);
    if (pbVar12 <= zData) goto LAB_00129eb5;
    bVar1 = *zData;
    if (bVar1 < 0x62) {
      if (bVar1 < 0x30) {
        if (bVar1 == 0x22) {
          zData = "\"";
        }
        else if (bVar1 == 0x24) {
          zData = "$";
        }
        else {
          if (bVar1 != 0x27) goto switchD_00129bde_caseD_70;
          zData = "\'";
        }
      }
      else if (bVar1 == 0x30) {
        zData = "";
      }
      else if (bVar1 == 0x5c) {
        zData = "\\";
      }
      else {
        if (bVar1 != 0x61) goto switchD_00129bde_caseD_70;
        zData = "\a";
      }
      goto LAB_00129d83;
    }
    switch(bVar1) {
    case 0x6e:
      zData = "\n";
      break;
    case 0x6f:
      if (pbVar8 + 2 < pbVar12) {
        bVar1 = pbVar8[2];
        if ((((ulong)(long)(char)bVar1 < 0xffffffffffffffc0) &&
            (ppuVar6 = __ctype_b_loc(), (char)bVar1 < '8')) &&
           (((*ppuVar6)[(char)bVar1] & 0x800) != 0)) {
          local_40 = 0;
          pbVar9 = pbVar8 + 3;
          uVar10 = 2;
          while( true ) {
            bVar1 = pbVar9[-1];
            uVar11 = uVar10;
            if (((0xffffffffffffffbf < (ulong)(long)(char)bVar1) || ('7' < (char)bVar1)) ||
               (((*ppuVar6)[(char)bVar1] & 0x800) == 0)) break;
            local_40 = (int)(char)bVar1 + local_40 * 8 + -0x30;
            uVar11 = uVar10 + 1;
            if ((3 < uVar10) ||
               (bVar14 = pbVar12 <= pbVar9, pbVar9 = pbVar9 + 1, uVar10 = uVar11, bVar14)) break;
          }
          if (0 < local_40) {
            jx9MemObjStringAppend(pObj,(char *)&local_40,1);
          }
          uVar10 = (ulong)((int)uVar11 - 2);
          lVar13 = 2;
          goto LAB_00129d98;
        }
      }
      zData = "o";
      break;
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
    case 0x77:
switchD_00129bde_caseD_70:
      break;
    case 0x72:
      zData = "\r";
      break;
    case 0x74:
      zData = "\t";
      break;
    case 0x76:
      zData = "\v";
      break;
    case 0x78:
      bVar1 = pbVar8[2];
      if ((0xffffffffffffffbf < (ulong)(long)(char)bVar1) ||
         (ppuVar6 = __ctype_b_loc(),
         (*(byte *)((long)*ppuVar6 + (long)(char)bVar1 * 2 + 1) & 0x10) == 0)) {
        zData = "x";
        break;
      }
      sVar4 = SyHexToint((int)(char)bVar1);
      iVar3 = sVar4 * 0x10;
      local_3c = iVar3;
      if (pbVar8 + 3 < pbVar12) {
        sVar4 = SyHexToint((int)(char)pbVar8[3]);
        local_3c = sVar4 + iVar3;
      }
      jx9MemObjStringAppend(pObj,(char *)&local_3c,1);
      lVar13 = 1;
      uVar10 = 3;
      goto LAB_00129d98;
    default:
      if (bVar1 == 0x62) {
        zData = "\b";
      }
      else {
        if (bVar1 != 0x66) goto switchD_00129bde_caseD_70;
        zData = "\f";
      }
    }
LAB_00129d83:
    jx9MemObjStringAppend(pObj,zData,1);
    uVar10 = 1;
    lVar13 = 1;
LAB_00129d98:
    pbVar9 = pbVar8 + uVar10 + lVar13;
  } while( true );
code_r0x00129b3c:
  if ((bVar1 == 0x5b) && (pbVar9 = pbVar9 + 1, pbVar9 < pbVar12)) {
    iVar3 = 1;
    do {
      if (*pbVar9 == 0x5d) {
        if (iVar3 < 2) {
          pbVar9 = pbVar9 + 1;
          break;
        }
        iVar3 = iVar3 + -1;
      }
      else if (*pbVar9 == 0x5b) {
        iVar3 = iVar3 + 1;
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 < pbVar12);
  }
LAB_00129da9:
  sVar4 = GenStateProcessStringExpression(local_48,(char *)pbVar8,(char *)pbVar9);
  pObj = (jx9_value *)0x0;
  if (sVar4 != -3) goto LAB_00129e6d;
  goto LAB_001299cf;
LAB_00129e6d:
  if (sVar4 == -10) {
    return -10;
  }
  local_4c = local_4c + 1;
  goto LAB_001299cc;
LAB_00129e4a:
  do {
    if (*pbVar9 == 0x7d) {
      if (iVar3 < 2) {
        lVar13 = 1;
        goto LAB_00129e84;
      }
      iVar3 = iVar3 + -1;
    }
    else if (*pbVar9 == 0x7b) {
      iVar3 = iVar3 + 1;
    }
    pbVar9 = pbVar9 + 1;
  } while (pbVar9 < pbVar12);
LAB_00129e81:
  lVar13 = 0;
LAB_00129e84:
  sVar4 = GenStateProcessStringExpression(local_48,(char *)pbVar8,(char *)pbVar9);
  if (sVar4 != -3) {
    if (sVar4 == -10) {
      return -10;
    }
    local_4c = local_4c + 1;
  }
  pbVar9 = pbVar9 + lVar13;
  goto LAB_001299cc;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileString(jx9_gen_state *pGen, sxi32 iCompileFlag)
{
	sxi32 rc;
	rc = GenStateCompileString(&(*pGen));
	SXUNUSED(iCompileFlag); /* cc warning */
	/* Compilation result */
	return rc;
}